

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int __thiscall
ExampleAppConsole::TextEditCallback(ExampleAppConsole *this,ImGuiInputTextCallbackData *data)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char **ppcVar6;
  char *local_110;
  char *history_str;
  int local_68;
  int prev_history_pos;
  int i_2;
  int i_1;
  int iStack_58;
  bool all_candidates_matches;
  int c_1;
  int match_len;
  int local_44;
  undefined1 local_40 [4];
  int i;
  ImVector<const_char_*> candidates;
  int iStack_28;
  char c;
  char *word_start;
  char *word_end;
  ImGuiInputTextCallbackData *data_local;
  ExampleAppConsole *this_local;
  
  if (data->EventFlag != 0x40) {
    if (data->EventFlag != 0x80) {
      return 0;
    }
    iVar4 = this->HistoryPos;
    if (data->EventKey == 0x203) {
      if (this->HistoryPos == -1) {
        this->HistoryPos = (this->History).Size + -1;
      }
      else if (0 < this->HistoryPos) {
        this->HistoryPos = this->HistoryPos + -1;
      }
    }
    else if (((data->EventKey == 0x204) && (this->HistoryPos != -1)) &&
            (iVar5 = this->HistoryPos + 1, this->HistoryPos = iVar5, (this->History).Size <= iVar5))
    {
      this->HistoryPos = -1;
    }
    if (iVar4 == this->HistoryPos) {
      return 0;
    }
    if (this->HistoryPos < 0) {
      local_110 = "";
    }
    else {
      ppcVar6 = ImVector<char_*>::operator[](&this->History,this->HistoryPos);
      local_110 = *ppcVar6;
    }
    ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
    ImGuiInputTextCallbackData::InsertChars(data,0,local_110,(char *)0x0);
    return 0;
  }
  pcVar1 = data->Buf;
  iVar4 = data->CursorPos;
  for (_iStack_28 = pcVar1 + iVar4;
      ((data->Buf < _iStack_28 &&
       (candidates.Data._7_1_ = _iStack_28[-1], candidates.Data._7_1_ != ' ')) &&
      ((candidates.Data._7_1_ != '\t' &&
       ((candidates.Data._7_1_ != ',' && (candidates.Data._7_1_ != ';'))))));
      _iStack_28 = _iStack_28 + -1) {
  }
  ImVector<const_char_*>::ImVector((ImVector<const_char_*> *)local_40);
  local_44 = 0;
  while( true ) {
    word_start._0_4_ = (int)(pcVar1 + iVar4);
    if ((this->Commands).Size <= local_44) break;
    ppcVar6 = ImVector<const_char_*>::operator[](&this->Commands,local_44);
    iVar5 = Strnicmp(*ppcVar6,_iStack_28,(int)word_start - iStack_28);
    if (iVar5 == 0) {
      ppcVar6 = ImVector<const_char_*>::operator[](&this->Commands,local_44);
      ImVector<const_char_*>::push_back((ImVector<const_char_*> *)local_40,ppcVar6);
    }
    local_44 = local_44 + 1;
  }
  if (local_40 == (undefined1  [4])0x0) {
    AddLog(this,"No match for \"%.*s\"!\n",(ulong)(uint)((int)word_start - iStack_28));
  }
  else {
    if (local_40 != (undefined1  [4])0x1) {
      iStack_58 = (int)word_start - iStack_28;
      do {
        i_1 = 0;
        bVar3 = true;
        prev_history_pos = 0;
        while( true ) {
          bVar2 = false;
          if (prev_history_pos < (int)local_40) {
            bVar2 = bVar3;
          }
          if (!bVar2) break;
          if (prev_history_pos == 0) {
            ppcVar6 = ImVector<const_char_*>::operator[]((ImVector<const_char_*> *)local_40,0);
            i_1 = toupper((int)(*ppcVar6)[iStack_58]);
          }
          else {
            if (i_1 != 0) {
              ppcVar6 = ImVector<const_char_*>::operator[]
                                  ((ImVector<const_char_*> *)local_40,prev_history_pos);
              iVar4 = toupper((int)(*ppcVar6)[iStack_58]);
              if (i_1 == iVar4) goto LAB_001a2bc1;
            }
            bVar3 = false;
          }
LAB_001a2bc1:
          prev_history_pos = prev_history_pos + 1;
        }
        if (!bVar3) goto LAB_001a2be7;
        iStack_58 = iStack_58 + 1;
      } while( true );
    }
    ImGuiInputTextCallbackData::DeleteChars
              (data,iStack_28 - *(int *)&data->Buf,(int)word_start - iStack_28);
    iVar4 = data->CursorPos;
    ppcVar6 = ImVector<const_char_*>::operator[]((ImVector<const_char_*> *)local_40,0);
    ImGuiInputTextCallbackData::InsertChars(data,iVar4,*ppcVar6,(char *)0x0);
    ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos," ",(char *)0x0);
  }
LAB_001a2ced:
  ImVector<const_char_*>::~ImVector((ImVector<const_char_*> *)local_40);
  return 0;
LAB_001a2be7:
  if (0 < iStack_58) {
    ImGuiInputTextCallbackData::DeleteChars
              (data,iStack_28 - *(int *)&data->Buf,(int)word_start - iStack_28);
    iVar4 = data->CursorPos;
    ppcVar6 = ImVector<const_char_*>::operator[]((ImVector<const_char_*> *)local_40,0);
    pcVar1 = *ppcVar6;
    ppcVar6 = ImVector<const_char_*>::operator[]((ImVector<const_char_*> *)local_40,0);
    ImGuiInputTextCallbackData::InsertChars(data,iVar4,pcVar1,*ppcVar6 + iStack_58);
  }
  AddLog(this,"Possible matches:\n");
  for (local_68 = 0; local_68 < (int)local_40; local_68 = local_68 + 1) {
    ppcVar6 = ImVector<const_char_*>::operator[]((ImVector<const_char_*> *)local_40,local_68);
    AddLog(this,"- %s\n",*ppcVar6);
  }
  goto LAB_001a2ced;
}

Assistant:

int     TextEditCallback(ImGuiInputTextCallbackData* data)
    {
        //AddLog("cursor: %d, selection: %d-%d", data->CursorPos, data->SelectionStart, data->SelectionEnd);
        switch (data->EventFlag)
        {
        case ImGuiInputTextFlags_CallbackCompletion:
            {
                // Example of TEXT COMPLETION

                // Locate beginning of current word
                const char* word_end = data->Buf + data->CursorPos;
                const char* word_start = word_end;
                while (word_start > data->Buf)
                {
                    const char c = word_start[-1];
                    if (c == ' ' || c == '\t' || c == ',' || c == ';')
                        break;
                    word_start--;
                }

                // Build a list of candidates
                ImVector<const char*> candidates;
                for (int i = 0; i < Commands.Size; i++)
                    if (Strnicmp(Commands[i], word_start, (int)(word_end - word_start)) == 0)
                        candidates.push_back(Commands[i]);

                if (candidates.Size == 0)
                {
                    // No match
                    AddLog("No match for \"%.*s\"!\n", (int)(word_end - word_start), word_start);
                }
                else if (candidates.Size == 1)
                {
                    // Single match. Delete the beginning of the word and replace it entirely so we've got nice casing.
                    data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                    data->InsertChars(data->CursorPos, candidates[0]);
                    data->InsertChars(data->CursorPos, " ");
                }
                else
                {
                    // Multiple matches. Complete as much as we can..
                    // So inputing "C"+Tab will complete to "CL" then display "CLEAR" and "CLASSIFY" as matches.
                    int match_len = (int)(word_end - word_start);
                    for (;;)
                    {
                        int c = 0;
                        bool all_candidates_matches = true;
                        for (int i = 0; i < candidates.Size && all_candidates_matches; i++)
                            if (i == 0)
                                c = toupper(candidates[i][match_len]);
                            else if (c == 0 || c != toupper(candidates[i][match_len]))
                                all_candidates_matches = false;
                        if (!all_candidates_matches)
                            break;
                        match_len++;
                    }

                    if (match_len > 0)
                    {
                        data->DeleteChars((int)(word_start - data->Buf), (int)(word_end - word_start));
                        data->InsertChars(data->CursorPos, candidates[0], candidates[0] + match_len);
                    }

                    // List matches
                    AddLog("Possible matches:\n");
                    for (int i = 0; i < candidates.Size; i++)
                        AddLog("- %s\n", candidates[i]);
                }

                break;
            }
        case ImGuiInputTextFlags_CallbackHistory:
            {
                // Example of HISTORY
                const int prev_history_pos = HistoryPos;
                if (data->EventKey == ImGuiKey_UpArrow)
                {
                    if (HistoryPos == -1)
                        HistoryPos = History.Size - 1;
                    else if (HistoryPos > 0)
                        HistoryPos--;
                }
                else if (data->EventKey == ImGuiKey_DownArrow)
                {
                    if (HistoryPos != -1)
                        if (++HistoryPos >= History.Size)
                            HistoryPos = -1;
                }

                // A better implementation would preserve the data on the current input line along with cursor position.
                if (prev_history_pos != HistoryPos)
                {
                    const char* history_str = (HistoryPos >= 0) ? History[HistoryPos] : "";
                    data->DeleteChars(0, data->BufTextLen);
                    data->InsertChars(0, history_str);
                }
            }
        }
        return 0;
    }